

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::chooseJoinpack(HEkkDualRow *this,HEkkDualRow *otherRow)

{
  int iVar1;
  pair<int,_double> *__first;
  double dVar2;
  
  iVar1 = otherRow->workCount;
  __first = (otherRow->workData).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::pair<int,double>const*,std::pair<int,double>*>
            (__first,__first + iVar1,
             (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + this->workCount);
  this->workCount = this->workCount + iVar1;
  dVar2 = otherRow->workTheta;
  if (this->workTheta <= otherRow->workTheta) {
    dVar2 = this->workTheta;
  }
  this->workTheta = dVar2;
  return;
}

Assistant:

void HEkkDualRow::chooseJoinpack(const HEkkDualRow* otherRow) {
  /**
   * Join pack of possible candidates in this row with possible
   * candidates in otherRow
   */
  const HighsInt otherCount = otherRow->workCount;
  const pair<HighsInt, double>* otherData = otherRow->workData.data();
  copy(otherData, otherData + otherCount, &workData[workCount]);
  workCount = workCount + otherCount;
  workTheta = min(workTheta, otherRow->workTheta);
}